

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::updateScrollBars(QMdiAreaPrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QMdiArea *pQVar6;
  QStyle *pQVar7;
  int *piVar8;
  QWidget *pQVar9;
  QRect *pQVar10;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  int startX;
  bool useVerticalScrollBar;
  bool useHorizontalScrollBar;
  int doubleFrameWidth;
  QMdiArea *q;
  int yOffset;
  int xOffset;
  QRect viewportRect;
  QSize max_1;
  QSize max;
  QRect childrenRect;
  QSize vbarExtent;
  QSize hbarExtent;
  QSize maxSize;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  Orientation in_stack_fffffffffffffedc;
  QSize *in_stack_fffffffffffffee0;
  QScrollBar *this_00;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  QRect *in_stack_fffffffffffffef0;
  QWidget *in_stack_fffffffffffffef8;
  int local_cc;
  bool local_9e;
  bool local_9d;
  int local_88 [4];
  int local_78 [6];
  undefined1 *local_60;
  undefined1 *local_58;
  QSize local_48;
  QSize local_38;
  undefined1 local_30 [16];
  undefined1 *local_20;
  undefined1 *local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI->ignoreGeometryChange & 1U) != 0) || (bVar1 = scrollBarsEnabled(in_RDI), !bVar1))
  goto LAB_00611607;
  pQVar6 = q_func(in_RDI);
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QAbstractScrollArea::maximumViewportSize
                       ((QAbstractScrollArea *)in_stack_fffffffffffffef0);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (undefined1 *)
             (**(code **)(*(long *)&(((in_RDI->super_QAbstractScrollAreaPrivate).hbar)->
                                    super_QAbstractSlider).super_QWidget + 0x70))();
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = (undefined1 *)
             (**(code **)(*(long *)&(((in_RDI->super_QAbstractScrollAreaPrivate).vbar)->
                                    super_QAbstractSlider).super_QWidget + 0x70))();
  pQVar7 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  iVar2 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x11,0,pQVar6);
  if (iVar2 != 0) {
    iVar2 = (int)(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth;
    if ((in_RDI->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOn) {
      piVar8 = QSize::rheight((QSize *)0x610f5d);
      *piVar8 = *piVar8 + iVar2 * -2;
    }
    if ((in_RDI->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOn) {
      piVar8 = QSize::rwidth((QSize *)0x610f96);
      *piVar8 = *piVar8 + iVar2 * -2;
    }
    piVar8 = QSize::rheight((QSize *)0x610fbb);
    *piVar8 = iVar2 * 2 + *piVar8;
    piVar8 = QSize::rwidth((QSize *)0x610fdb);
    *piVar8 = iVar2 * 2 + *piVar8;
  }
  local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x611015);
  if (bVar1) {
    pQVar9 = &QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x61102f)->
              super_QWidget;
    bVar1 = QWidget::isMaximized(pQVar9);
    if (!bVar1) goto LAB_00611072;
    pQVar9 = &QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x611051)->
              super_QWidget;
    pQVar10 = QWidget::geometry(pQVar9);
    local_30 = *(undefined1 (*) [16])pQVar10;
  }
  else {
LAB_00611072:
    local_30 = (undefined1  [16])QWidget::childrenRect(in_stack_fffffffffffffef8);
  }
  local_9d = useScrollBar((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  local_9e = useScrollBar((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  if ((local_9d) && (!local_9e)) {
    local_38 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    QSize::height((QSize *)0x61110c);
    QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    local_38 = ::operator-(in_stack_fffffffffffffee0,
                           (QSize *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_9e = useScrollBar((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  }
  if ((local_9e != false) && (!local_9d)) {
    local_48 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    QSize::width((QSize *)0x61118d);
    QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    local_48 = ::operator-(in_stack_fffffffffffffee0,
                           (QSize *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_9d = useScrollBar((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  }
  if ((local_9d != false) &&
     ((in_RDI->super_QAbstractScrollAreaPrivate).hbarpolicy != ScrollBarAlwaysOn)) {
    iVar2 = QSize::height((QSize *)0x611206);
    piVar8 = QSize::rheight((QSize *)0x611217);
    *piVar8 = *piVar8 - iVar2;
  }
  if ((local_9e != false) &&
     ((in_RDI->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOn)) {
    iVar2 = QSize::width((QSize *)0x611249);
    piVar8 = QSize::rwidth((QSize *)0x61125a);
    *piVar8 = *piVar8 - iVar2;
  }
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
  QRect::QRect(in_stack_fffffffffffffef0,
               (QPoint *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee0);
  bVar1 = QWidget::isLeftToRight((QWidget *)0x6112bd);
  if (bVar1) {
    local_cc = QRect::left((QRect *)0x6112d0);
  }
  else {
    local_cc = QRect::right((QRect *)0x6112e3);
    iVar2 = QRect::right((QRect *)0x6112f4);
    local_cc = local_cc - iVar2;
  }
  if (((in_RDI->isSubWindowsTiled & 1U) != 0) &&
     (iVar2 = QAbstractSlider::value
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)), iVar2 != 0)
     ) {
    QAbstractSlider::setValue
              ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  }
  local_78[3] = QAbstractSlider::value
                          ((QAbstractSlider *)
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  local_78[3] = local_cc + local_78[3];
  local_78[2] = 0;
  qMin<int>(local_78 + 2,local_78 + 3);
  iVar2 = local_78[3];
  local_78[1] = 0;
  iVar3 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_78[0] = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
  ;
  local_78[0] = (iVar2 + iVar3) - local_78[0];
  qMax<int>(local_78 + 1,local_78);
  QAbstractSlider::setRange
            ((QAbstractSlider *)in_stack_fffffffffffffee0,in_stack_fffffffffffffeec,
             in_stack_fffffffffffffee8);
  iVar2 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  QAbstractSlider::setPageStep
            ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffecc);
  QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  QAbstractSlider::setSingleStep
            ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffecc);
  if (((in_RDI->isSubWindowsTiled & 1U) != 0) &&
     (iVar3 = QAbstractSlider::value
                        ((QAbstractSlider *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)), iVar3 != 0)
     ) {
    QAbstractSlider::setValue
              ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               iVar2);
  }
  iVar4 = QRect::top((QRect *)0x6114d2);
  local_88[3] = QAbstractSlider::value((QAbstractSlider *)CONCAT44(iVar4,in_stack_fffffffffffffed0))
  ;
  local_88[3] = iVar4 + local_88[3];
  this_00 = (in_RDI->super_QAbstractScrollAreaPrivate).vbar;
  local_88[2] = 0;
  piVar8 = qMin<int>(local_88 + 2,local_88 + 3);
  iVar2 = *piVar8;
  local_88[1] = 0;
  iVar3 = local_88[3];
  iVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  iVar3 = iVar3 + iVar5;
  local_88[0] = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                             );
  local_88[0] = iVar3 - local_88[0];
  qMax<int>(local_88 + 1,local_88);
  QAbstractSlider::setRange(&this_00->super_QAbstractSlider,iVar2,in_stack_fffffffffffffee8);
  QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  QAbstractSlider::setPageStep
            ((QAbstractSlider *)CONCAT44(iVar4,in_stack_fffffffffffffed0),in_stack_fffffffffffffecc)
  ;
  QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  QAbstractSlider::setSingleStep
            ((QAbstractSlider *)CONCAT44(iVar4,in_stack_fffffffffffffed0),in_stack_fffffffffffffecc)
  ;
LAB_00611607:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::updateScrollBars()
{
    if (ignoreGeometryChange || !scrollBarsEnabled())
        return;

    Q_Q(QMdiArea);
    QSize maxSize = q->maximumViewportSize();
    QSize hbarExtent = hbar->sizeHint();
    QSize vbarExtent = vbar->sizeHint();

    if (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q)) {
        const int doubleFrameWidth = frameWidth * 2;
        if (hbarpolicy == Qt::ScrollBarAlwaysOn)
            maxSize.rheight() -= doubleFrameWidth;
        if (vbarpolicy == Qt::ScrollBarAlwaysOn)
            maxSize.rwidth() -= doubleFrameWidth;
        hbarExtent.rheight() += doubleFrameWidth;
        vbarExtent.rwidth() += doubleFrameWidth;
    }

    const QRect childrenRect = active && active->isMaximized()
                               ? active->geometry() : viewport->childrenRect();
    bool useHorizontalScrollBar = useScrollBar(childrenRect, maxSize, Qt::Horizontal);
    bool useVerticalScrollBar = useScrollBar(childrenRect, maxSize, Qt::Vertical);

    if (useHorizontalScrollBar && !useVerticalScrollBar) {
        const QSize max = maxSize - QSize(0, hbarExtent.height());
        useVerticalScrollBar = useScrollBar(childrenRect, max, Qt::Vertical);
    }

    if (useVerticalScrollBar && !useHorizontalScrollBar) {
        const QSize max = maxSize - QSize(vbarExtent.width(), 0);
        useHorizontalScrollBar = useScrollBar(childrenRect, max, Qt::Horizontal);
    }

    if (useHorizontalScrollBar && hbarpolicy != Qt::ScrollBarAlwaysOn)
        maxSize.rheight() -= hbarExtent.height();
    if (useVerticalScrollBar && vbarpolicy != Qt::ScrollBarAlwaysOn)
        maxSize.rwidth() -= vbarExtent.width();

    QRect viewportRect(QPoint(0, 0), maxSize);
    const int startX = q->isLeftToRight() ? childrenRect.left() : viewportRect.right()
                                                                  - childrenRect.right();

    // Horizontal scroll bar.
    if (isSubWindowsTiled && hbar->value() != 0)
        hbar->setValue(0);
    const int xOffset = startX + hbar->value();
    hbar->setRange(qMin(0, xOffset),
                   qMax(0, xOffset + childrenRect.width() - viewportRect.width()));
    hbar->setPageStep(childrenRect.width());
    hbar->setSingleStep(childrenRect.width() / 20);

    // Vertical scroll bar.
    if (isSubWindowsTiled && vbar->value() != 0)
        vbar->setValue(0);
    const int yOffset = childrenRect.top() + vbar->value();
    vbar->setRange(qMin(0, yOffset),
                   qMax(0, yOffset + childrenRect.height() - viewportRect.height()));
    vbar->setPageStep(childrenRect.height());
    vbar->setSingleStep(childrenRect.height() / 20);
}